

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O3

void Curl_strntoupper(char *dest,char *src,size_t n)

{
  char cVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  
  if (n != 0) {
    lVar2 = 0;
    do {
      cVar1 = src[lVar2];
      cVar3 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar3 = cVar1;
      }
      dest[lVar2] = cVar3;
    } while ((src[lVar2] != '\0') && (bVar4 = n - 1 != lVar2, lVar2 = lVar2 + 1, bVar4));
  }
  return;
}

Assistant:

void Curl_strntoupper(char *dest, const char *src, size_t n)
{
  if(n < 1)
    return;

  do {
    *dest++ = Curl_raw_toupper(*src);
  } while(*src++ && --n);
}